

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsDomain.cpp
# Opt level: O3

void __thiscall
HighsDomain::ConflictPoolPropagation::linkWatchedLiteral
          (ConflictPoolPropagation *this,HighsInt linkPos)

{
  int iVar1;
  int iVar2;
  pointer pWVar3;
  pointer piVar4;
  vector<int,_std::allocator<int>_> *pvVar5;
  
  pWVar3 = (this->watchedLiterals_).
           super__Vector_base<HighsDomain::ConflictPoolPropagation::WatchedLiteral,_std::allocator<HighsDomain::ConflictPoolPropagation::WatchedLiteral>_>
           ._M_impl.super__Vector_impl_data._M_start;
  iVar1 = pWVar3[linkPos].domchg.column;
  pvVar5 = &this->colLowerWatched_;
  if (pWVar3[linkPos].domchg.boundtype != kLower) {
    pvVar5 = &this->colUpperWatched_;
  }
  piVar4 = (pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  pWVar3[linkPos].prev = -1;
  iVar2 = piVar4[iVar1];
  pWVar3[linkPos].next = iVar2;
  if ((long)iVar2 != -1) {
    pWVar3[iVar2].prev = linkPos;
    piVar4[iVar1] = linkPos;
  }
  return;
}

Assistant:

void HighsDomain::ConflictPoolPropagation::linkWatchedLiteral(
    HighsInt linkPos) {
  assert(watchedLiterals_[linkPos].domchg.column != -1);
  HighsInt& head =
      watchedLiterals_[linkPos].domchg.boundtype == HighsBoundType::kLower
          ? colLowerWatched_[watchedLiterals_[linkPos].domchg.column]
          : colUpperWatched_[watchedLiterals_[linkPos].domchg.column];

  watchedLiterals_[linkPos].prev = -1;
  watchedLiterals_[linkPos].next = head;
  if (head != -1) {
    watchedLiterals_[head].prev = linkPos;
    head = linkPos;
  }
}